

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggerTest.cpp
# Opt level: O2

int main(void)

{
  LogLevel LVar1;
  Logger *pLVar2;
  Logger local_330;
  Fmt local_118;
  allocator<char> local_12;
  allocator<char> local_11;
  
  higan::Logger::SetLogLevel(DEBUG);
  LVar1 = higan::Logger::GetLogLevel();
  if ((int)LVar1 < 1) {
    higan::Logger::Logger
              (&local_330,DEBUG,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/base/test/LoggerTest.cpp"
               ,0xb,"main");
    higan::Fmt::Fmt(&local_118,"%s: %s","DEBUG");
    pLVar2 = higan::Logger::operator<<(&local_330,&local_118);
    higan::Logger::operator<<(pLVar2," 1");
    higan::Logger::~Logger(&local_330);
  }
  LVar1 = higan::Logger::GetLogLevel();
  if ((int)LVar1 < 2) {
    higan::Logger::Logger
              (&local_330,INFO,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/base/test/LoggerTest.cpp"
               ,0xc,"main");
    higan::Fmt::Fmt(&local_118,"%s: %s","INFO");
    pLVar2 = higan::Logger::operator<<(&local_330,&local_118);
    higan::Logger::operator<<(pLVar2," 1");
    higan::Logger::~Logger(&local_330);
  }
  LVar1 = higan::Logger::GetLogLevel();
  if ((int)LVar1 < 3) {
    higan::Logger::Logger
              (&local_330,WARN,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/base/test/LoggerTest.cpp"
               ,0xd,"main");
    higan::Fmt::Fmt(&local_118,"%s: %s","WARN");
    pLVar2 = higan::Logger::operator<<(&local_330,&local_118);
    higan::Logger::operator<<(pLVar2," 1");
    higan::Logger::~Logger(&local_330);
  }
  LVar1 = higan::Logger::GetLogLevel();
  if ((int)LVar1 < 4) {
    higan::Logger::Logger
              (&local_330,ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/base/test/LoggerTest.cpp"
               ,0xe,"main");
    higan::Fmt::Fmt(&local_118,"%s: %s","ERROR");
    pLVar2 = higan::Logger::operator<<(&local_330,&local_118);
    higan::Logger::operator<<(pLVar2," 1");
    higan::Logger::~Logger(&local_330);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,"/root/log/test",&local_12);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"test",&local_11);
  higan::Logger::SetLogToFile((string *)&local_330,(string *)&local_118,false);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_330);
  LVar1 = higan::Logger::GetLogLevel();
  if ((int)LVar1 < 1) {
    higan::Logger::Logger
              (&local_330,DEBUG,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/base/test/LoggerTest.cpp"
               ,0x12,"main");
    higan::Fmt::Fmt(&local_118,"%s: %s","DEBUG");
    pLVar2 = higan::Logger::operator<<(&local_330,&local_118);
    higan::Logger::operator<<(pLVar2," 1");
    higan::Logger::~Logger(&local_330);
  }
  LVar1 = higan::Logger::GetLogLevel();
  if ((int)LVar1 < 2) {
    higan::Logger::Logger
              (&local_330,INFO,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/base/test/LoggerTest.cpp"
               ,0x13,"main");
    higan::Fmt::Fmt(&local_118,"%s: %s","INFO");
    pLVar2 = higan::Logger::operator<<(&local_330,&local_118);
    higan::Logger::operator<<(pLVar2," 1");
    higan::Logger::~Logger(&local_330);
  }
  LVar1 = higan::Logger::GetLogLevel();
  if ((int)LVar1 < 3) {
    higan::Logger::Logger
              (&local_330,WARN,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/base/test/LoggerTest.cpp"
               ,0x14,"main");
    higan::Fmt::Fmt(&local_118,"%s: %s","WARN");
    pLVar2 = higan::Logger::operator<<(&local_330,&local_118);
    higan::Logger::operator<<(pLVar2," 1");
    higan::Logger::~Logger(&local_330);
  }
  LVar1 = higan::Logger::GetLogLevel();
  if ((int)LVar1 < 4) {
    higan::Logger::Logger
              (&local_330,ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/base/test/LoggerTest.cpp"
               ,0x15,"main");
    higan::Fmt::Fmt(&local_118,"%s: %s","ERROR");
    pLVar2 = higan::Logger::operator<<(&local_330,&local_118);
    higan::Logger::operator<<(pLVar2," 1");
    higan::Logger::~Logger(&local_330);
  }
  return 0;
}

Assistant:

int main()
{
	higan::Logger::SetLogLevel(higan::Logger::DEBUG);

	LOG_DEBUG << higan::Fmt("%s: %s", "DEBUG", "DEBUG") << " 1";
	LOG_INFO << higan::Fmt("%s: %s", "INFO", "INFO") << " 1";
	LOG_WARN << higan::Fmt("%s: %s", "WARN", "WARN") << " 1";
	LOG_ERROR << higan::Fmt("%s: %s", "ERROR", "ERROR") << " 1";

	higan::Logger::SetLogToFile("/root/log/test", "test", false);

	LOG_DEBUG << higan::Fmt("%s: %s", "DEBUG", "DEBUG") << " 1";
	LOG_INFO << higan::Fmt("%s: %s", "INFO", "INFO") << " 1";
	LOG_WARN << higan::Fmt("%s: %s", "WARN", "WARN") << " 1";
	LOG_ERROR << higan::Fmt("%s: %s", "ERROR", "ERROR") << " 1";

	return 0;
}